

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::StatsdPullAtomConfig::Serialize(StatsdPullAtomConfig *this,Message *msg)

{
  AtomId *pAVar1;
  int *piVar2;
  pointer pbVar3;
  uint8_t *src_begin;
  AtomId *it;
  AtomId *pAVar4;
  int *piVar5;
  pointer str;
  
  pAVar1 = (this->pull_atom_id_).
           super__Vector_base<perfetto::protos::gen::AtomId,_std::allocator<perfetto::protos::gen::AtomId>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pAVar4 = (this->pull_atom_id_).
                super__Vector_base<perfetto::protos::gen::AtomId,_std::allocator<perfetto::protos::gen::AtomId>_>
                ._M_impl.super__Vector_impl_data._M_start; pAVar4 != pAVar1; pAVar4 = pAVar4 + 1) {
    protozero::Message::AppendVarInt<perfetto::protos::gen::AtomId>(msg,1,*pAVar4);
  }
  piVar2 = (this->raw_pull_atom_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar5 = (this->raw_pull_atom_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar5 != piVar2; piVar5 = piVar5 + 1) {
    protozero::Message::AppendVarInt<int>(msg,2,*piVar5);
  }
  if (((this->_has_field_).super__Base_bitset<1UL>._M_w & 8) != 0) {
    protozero::Message::AppendVarInt<int>(msg,3,this->pull_frequency_ms_);
  }
  pbVar3 = (this->packages_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (str = (this->packages_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; str != pbVar3; str = str + 1) {
    protozero::Message::AppendString(msg,4,str);
  }
  src_begin = (uint8_t *)(this->unknown_fields_)._M_dataplus._M_p;
  protozero::Message::WriteToStream
            (msg,src_begin,src_begin + (this->unknown_fields_)._M_string_length);
  return;
}

Assistant:

void StatsdPullAtomConfig::Serialize(::protozero::Message* msg) const {
  // Field 1: pull_atom_id
  for (auto& it : pull_atom_id_) {
    msg->AppendVarInt(1, it);
  }

  // Field 2: raw_pull_atom_id
  for (auto& it : raw_pull_atom_id_) {
    msg->AppendVarInt(2, it);
  }

  // Field 3: pull_frequency_ms
  if (_has_field_[3]) {
    msg->AppendVarInt(3, pull_frequency_ms_);
  }

  // Field 4: packages
  for (auto& it : packages_) {
    msg->AppendString(4, it);
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}